

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int compression_code_lzma(archive *a,la_zstream_conflict *lastrm,la_zaction action)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  
  puVar1 = (undefined8 *)lastrm->real_stream;
  *puVar1 = lastrm->next_in;
  puVar1[1] = lastrm->avail_in;
  puVar1[2] = lastrm->total_in;
  puVar1[3] = lastrm->next_out;
  puVar1[4] = lastrm->avail_out;
  puVar1[5] = lastrm->total_out;
  uVar2 = lzma_code(puVar1,(action == ARCHIVE_Z_FINISH) * '\x03');
  lastrm->next_in = (uchar *)*puVar1;
  lastrm->avail_in = puVar1[1];
  lastrm->total_in = puVar1[2];
  lastrm->next_out = (uchar *)puVar1[3];
  lastrm->avail_out = puVar1[4];
  lastrm->total_out = puVar1[5];
  if (1 < uVar2) {
    if (uVar2 == 6) {
      lVar3 = lzma_memusage(puVar1);
      archive_set_error(a,0xc,"lzma compression error: %ju MiB would have been needed",
                        lVar3 + 0xfffffU >> 0x14);
    }
    else {
      archive_set_error(a,-1,"lzma compression failed: lzma_code() call returned status %d",
                        (ulong)uVar2);
    }
    uVar2 = 0xffffffe2;
  }
  return uVar2;
}

Assistant:

static int
compression_code_lzma(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	lzma_stream *strm;
	int r;

	strm = (lzma_stream *)lastrm->real_stream;
	strm->next_in = lastrm->next_in;
	strm->avail_in = lastrm->avail_in;
	strm->total_in = lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = lastrm->avail_out;
	strm->total_out = lastrm->total_out;
	r = lzma_code(strm,
	    (action == ARCHIVE_Z_FINISH)? LZMA_FINISH: LZMA_RUN);
	lastrm->next_in = strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in = strm->total_in;
	lastrm->next_out = strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out = strm->total_out;
	switch (r) {
	case LZMA_OK:
		/* Non-finishing case */
		return (ARCHIVE_OK);
	case LZMA_STREAM_END:
		/* This return can only occur in finishing case. */
		return (ARCHIVE_EOF);
	case LZMA_MEMLIMIT_ERROR:
		archive_set_error(a, ENOMEM,
		    "lzma compression error:"
		    " %ju MiB would have been needed",
		    (uintmax_t)((lzma_memusage(strm) + 1024 * 1024 -1)
			/ (1024 * 1024)));
		return (ARCHIVE_FATAL);
	default:
		/* Any other return value indicates an error */
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma compression failed:"
		    " lzma_code() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}